

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void avx::ProjectionProfile
               (uint32_t rowSize,uint8_t *imageStart,uint32_t height,bool horizontal,uint32_t *out,
               uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 *puVar5;
  byte in_CL;
  int in_EDX;
  undefined1 (*in_RSI) [32];
  uint in_EDI;
  undefined1 (*in_R8) [32];
  uint in_R9D;
  uint in_stack_00000008;
  uint8_t *imageXEnd_1;
  uint8_t *imageX;
  simd sumLoHi;
  simd dataHi_1;
  simd dataLo_1;
  simd data_5;
  simd simdSum;
  simd *srcEnd;
  simd *src_1;
  uint8_t *imageYEnd_1;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint8_t *imageXEnd;
  simd data_4;
  simd data_3;
  simd data_2;
  simd data_1;
  simd dataHi;
  simd dataLo;
  simd data;
  simd *src;
  simd *dst;
  simd simdSum_4;
  simd simdSum_3;
  simd simdSum_2;
  simd simdSum_1;
  uint8_t *imageSimdYEnd;
  uint8_t *imageSimdY;
  uint8_t *imageSimdXEnd;
  simd zero;
  int local_ab0;
  int iStack_aac;
  int iStack_aa8;
  int iStack_aa4;
  int iStack_aa0;
  int iStack_a9c;
  int iStack_a98;
  int iStack_a94;
  byte *local_a90;
  byte *local_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [32];
  undefined1 (*local_9d0) [32];
  undefined1 (*local_9c8) [32];
  undefined1 (*local_9c0) [32];
  undefined1 (*local_9b0) [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 (*local_810) [32];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  uint local_7d4;
  undefined1 (*local_7d0) [32];
  undefined1 local_7c5;
  undefined1 (*local_7c0) [32];
  uint local_7b4;
  undefined1 (*local_7b0) [32];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  int *local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_300 [32];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_5a0 = 0;
  uStack_598 = 0;
  uStack_590 = 0;
  uStack_588 = 0;
  local_800 = 0;
  uStack_7f8 = 0;
  uStack_7f0 = 0;
  uStack_7e8 = 0;
  local_7d0 = in_R8;
  local_7c0 = in_RSI;
  if ((in_CL & 1) == 0) {
    local_9c0 = (undefined1 (*) [32])(*in_RSI + in_EDX * in_EDI);
    local_7c5 = 0;
    local_7d4 = in_R9D;
    local_7b4 = in_EDI;
    for (; local_7c0 != local_9c0; local_7c0 = (undefined1 (*) [32])(*local_7c0 + local_7b4)) {
      local_9d0 = local_7c0 + local_7d4;
      local_640 = 0;
      uStack_638 = 0;
      uStack_630 = 0;
      uStack_628 = 0;
      local_a00 = ZEXT1632(ZEXT816(0));
      for (local_9c8 = local_7c0; local_9c8 != local_9d0; local_9c8 = local_9c8 + 1) {
        local_7b0 = local_9c8;
        local_a20 = *(undefined8 *)*local_9c8;
        uStack_a18 = *(undefined8 *)(*local_9c8 + 8);
        uStack_a10 = *(undefined8 *)(*local_9c8 + 0x10);
        uStack_a08 = *(undefined8 *)(*local_9c8 + 0x18);
        local_580 = local_800;
        uStack_578 = uStack_7f8;
        uStack_570 = uStack_7f0;
        uStack_568 = uStack_7e8;
        auVar1._8_8_ = uStack_7f8;
        auVar1._0_8_ = local_800;
        auVar1._16_8_ = uStack_7f0;
        auVar1._24_8_ = uStack_7e8;
        local_a40 = vpunpcklbw_avx2(*local_9c8,auVar1);
        local_500 = local_800;
        uStack_4f8 = uStack_7f8;
        uStack_4f0 = uStack_7f0;
        uStack_4e8 = uStack_7e8;
        auVar2._8_8_ = uStack_7f8;
        auVar2._0_8_ = local_800;
        auVar2._16_8_ = uStack_7f0;
        auVar2._24_8_ = uStack_7e8;
        local_a60 = vpunpckhbw_avx2(*local_9c8,auVar2);
        local_60 = local_a40._0_8_;
        uStack_58 = local_a40._8_8_;
        uStack_50 = local_a40._16_8_;
        uStack_48 = local_a40._24_8_;
        local_80 = local_a60._0_8_;
        uStack_78 = local_a60._8_8_;
        uStack_70 = local_a60._16_8_;
        uStack_68 = local_a60._24_8_;
        local_a80 = vpaddw_avx2(local_a40,local_a60);
        local_2e0 = local_a00._0_8_;
        uStack_2d8 = local_a00._8_8_;
        uStack_2d0 = local_a00._16_8_;
        uStack_2c8 = local_a00._24_8_;
        local_460 = local_a80._0_8_;
        uStack_458 = local_a80._8_8_;
        uStack_450 = local_a80._16_8_;
        uStack_448 = local_a80._24_8_;
        local_480 = local_800;
        uStack_478 = uStack_7f8;
        uStack_470 = uStack_7f0;
        uStack_468 = uStack_7e8;
        auVar3._8_8_ = uStack_7f8;
        auVar3._0_8_ = local_800;
        auVar3._16_8_ = uStack_7f0;
        auVar3._24_8_ = uStack_7e8;
        local_2a0 = vpunpcklwd_avx2(local_a80,auVar3);
        local_3a0 = local_a80._0_8_;
        uStack_398 = local_a80._8_8_;
        uStack_390 = local_a80._16_8_;
        uStack_388 = local_a80._24_8_;
        local_3c0 = local_800;
        uStack_3b8 = uStack_7f8;
        uStack_3b0 = uStack_7f0;
        uStack_3a8 = uStack_7e8;
        auVar4._8_8_ = uStack_7f8;
        auVar4._0_8_ = local_800;
        auVar4._16_8_ = uStack_7f0;
        auVar4._24_8_ = uStack_7e8;
        local_2c0 = vpunpckhwd_avx2(local_a80,auVar4);
        local_300 = vpaddd_avx2(local_2a0,local_2c0);
        local_a00 = vpaddd_avx2(local_a00,local_300);
        local_560 = local_a20;
        uStack_558 = uStack_a18;
        uStack_550 = uStack_a10;
        uStack_548 = uStack_a08;
        local_4e0 = local_a20;
        uStack_4d8 = uStack_a18;
        uStack_4d0 = uStack_a10;
        uStack_4c8 = uStack_a08;
      }
      if (totalSimdWidth != 0) {
        local_a88 = *local_7c0 + in_stack_00000008;
        local_a90 = local_a88 + totalSimdWidth;
        for (; local_a88 != local_a90; local_a88 = local_a88 + 1) {
          *(uint *)*local_7d0 = (uint)*local_a88 + *(int *)*local_7d0;
        }
      }
      memset(&local_ab0,0,0x20);
      local_748 = &local_ab0;
      local_780 = local_a00._0_8_;
      uStack_778 = local_a00._8_8_;
      uStack_770 = local_a00._16_8_;
      uStack_768 = local_a00._24_8_;
      iStack_aac = local_a00._4_4_;
      local_ab0 = local_a00._0_4_;
      iStack_aa4 = local_a00._12_4_;
      iStack_aa8 = local_a00._8_4_;
      iStack_a9c = local_a00._20_4_;
      iStack_aa0 = local_a00._16_4_;
      iStack_a94 = local_a00._28_4_;
      iStack_a98 = local_a00._24_4_;
      *(int *)*local_7d0 =
           local_ab0 + iStack_aac + iStack_aa8 + iStack_aa4 + iStack_aa0 + iStack_a9c + iStack_a98 +
           iStack_a94 + *(int *)*local_7d0;
      local_7d0 = (undefined1 (*) [32])(*local_7d0 + 4);
    }
  }
  else {
    for (; local_7c0 != (undefined1 (*) [32])(*in_RSI + in_stack_00000008);
        local_7c0 = local_7c0 + 1) {
      local_840 = ZEXT1632(ZEXT816(0));
      local_860 = ZEXT1632(ZEXT816(0));
      local_880 = ZEXT1632(ZEXT816(0));
      local_8a0 = ZEXT1632(ZEXT816(0));
      for (local_810 = local_7c0; local_810 != (undefined1 (*) [32])(*local_7c0 + in_EDX * in_EDI);
          local_810 = (undefined1 (*) [32])(*local_810 + in_EDI)) {
        auVar2 = vpunpcklbw_avx2(*local_810,ZEXT1632(ZEXT816(0)));
        auVar1 = vpunpckhbw_avx2(*local_810,ZEXT1632(ZEXT816(0)));
        auVar3 = vpunpcklwd_avx2(auVar2,ZEXT1632(ZEXT816(0)));
        auVar2 = vpunpckhwd_avx2(auVar2,ZEXT1632(ZEXT816(0)));
        auVar4 = vpunpcklwd_avx2(auVar1,ZEXT1632(ZEXT816(0)));
        auVar1 = vpunpckhwd_avx2(auVar1,ZEXT1632(ZEXT816(0)));
        local_840 = vpaddd_avx2(auVar3,local_840);
        local_860 = vpaddd_avx2(auVar2,local_860);
        local_880 = vpaddd_avx2(auVar4,local_880);
        local_8a0 = vpaddd_avx2(auVar1,local_8a0);
      }
      auVar1 = vpaddd_avx2(local_840,*local_7d0);
      local_680 = auVar1._0_8_;
      uStack_678 = auVar1._8_8_;
      uStack_670 = auVar1._16_8_;
      uStack_668 = auVar1._24_8_;
      *(undefined8 *)*local_7d0 = local_680;
      *(undefined8 *)(*local_7d0 + 8) = uStack_678;
      *(undefined8 *)(*local_7d0 + 0x10) = uStack_670;
      *(undefined8 *)(*local_7d0 + 0x18) = uStack_668;
      auVar1 = vpaddd_avx2(local_860,local_7d0[1]);
      local_6c0 = auVar1._0_8_;
      uStack_6b8 = auVar1._8_8_;
      uStack_6b0 = auVar1._16_8_;
      uStack_6a8 = auVar1._24_8_;
      *(undefined8 *)local_7d0[1] = local_6c0;
      *(undefined8 *)(local_7d0[1] + 8) = uStack_6b8;
      *(undefined8 *)(local_7d0[1] + 0x10) = uStack_6b0;
      *(undefined8 *)(local_7d0[1] + 0x18) = uStack_6a8;
      auVar1 = vpaddd_avx2(local_880,local_7d0[2]);
      local_700 = auVar1._0_8_;
      uStack_6f8 = auVar1._8_8_;
      uStack_6f0 = auVar1._16_8_;
      uStack_6e8 = auVar1._24_8_;
      *(undefined8 *)local_7d0[2] = local_700;
      *(undefined8 *)(local_7d0[2] + 8) = uStack_6f8;
      *(undefined8 *)(local_7d0[2] + 0x10) = uStack_6f0;
      *(undefined8 *)(local_7d0[2] + 0x18) = uStack_6e8;
      auVar1 = vpaddd_avx2(local_8a0,local_7d0[3]);
      local_740 = auVar1._0_8_;
      uStack_738 = auVar1._8_8_;
      uStack_730 = auVar1._16_8_;
      uStack_728 = auVar1._24_8_;
      *(undefined8 *)local_7d0[3] = local_740;
      *(undefined8 *)(local_7d0[3] + 8) = uStack_738;
      *(undefined8 *)(local_7d0[3] + 0x10) = uStack_730;
      *(undefined8 *)(local_7d0[3] + 0x18) = uStack_728;
      local_7d0 = local_7d0 + 4;
    }
    if (totalSimdWidth != 0) {
      puVar5 = *local_7c0;
      for (; local_7c0 != (undefined1 (*) [32])(puVar5 + totalSimdWidth);
          local_7c0 = (undefined1 (*) [32])(*local_7c0 + 1)) {
        for (local_9b0 = local_7c0; local_9b0 != (undefined1 (*) [32])(*local_7c0 + in_EDX * in_EDI)
            ; local_9b0 = (undefined1 (*) [32])(*local_9b0 + in_EDI)) {
          *(uint *)*local_7d0 = (uint)(byte)(*local_9b0)[0] + *(int *)*local_7d0;
        }
        local_7d0 = (undefined1 (*) [32])(*local_7d0 + 4);
      }
    }
  }
  return;
}

Assistant:

void ProjectionProfile( uint32_t rowSize, const uint8_t * imageStart, uint32_t height, bool horizontal,
                            uint32_t * out, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd zero = _mm256_setzero_si256();

        if( horizontal ) {
            const uint8_t * imageSimdXEnd = imageStart + totalSimdWidth;

            for( ; imageStart != imageSimdXEnd; imageStart += simdSize, out += simdSize ) {
                const uint8_t * imageSimdY = imageStart;
                const uint8_t * imageSimdYEnd = imageSimdY + height * rowSize;
                simd simdSum_1 = _mm256_setzero_si256();
                simd simdSum_2 = _mm256_setzero_si256();
                simd simdSum_3 = _mm256_setzero_si256();
                simd simdSum_4 = _mm256_setzero_si256();

                simd * dst = reinterpret_cast <simd*> (out);

                for( ; imageSimdY != imageSimdYEnd; imageSimdY += rowSize) {
                    const simd * src    = reinterpret_cast <const simd*> (imageSimdY);

                    const simd data = _mm256_loadu_si256( src );

                    const simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                    const simd dataHi  = _mm256_unpackhi_epi8( data, zero );

                    const simd data_1 = _mm256_unpacklo_epi16( dataLo, zero );
                    const simd data_2 = _mm256_unpackhi_epi16( dataLo, zero );
                    const simd data_3 = _mm256_unpacklo_epi16( dataHi, zero );
                    const simd data_4 = _mm256_unpackhi_epi16( dataHi, zero );
                    simdSum_1 = _mm256_add_epi32( data_1, simdSum_1 );
                    simdSum_2 = _mm256_add_epi32( data_2, simdSum_2 );
                    simdSum_3 = _mm256_add_epi32( data_3, simdSum_3 );
                    simdSum_4 = _mm256_add_epi32( data_4, simdSum_4 );
                }

                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_1, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_2, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_3, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_4, _mm256_loadu_si256( dst ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t* imageXEnd = imageStart + nonSimdWidth;

                for( ; imageStart != imageXEnd; ++imageStart, ++out ) {
                    const uint8_t * imageY    = imageStart;
                    const uint8_t * imageYEnd = imageY + height * rowSize;

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*out) += (*imageY);
                }
            }
        }
        else {
            const uint8_t * imageYEnd = imageStart + height * rowSize;

            for( ; imageStart != imageYEnd; imageStart += rowSize, ++out ) {
                const simd * src    = reinterpret_cast <const simd*> (imageStart);
                const simd * srcEnd = src + simdWidth;
                simd simdSum = _mm256_setzero_si256();

                for( ; src != srcEnd; ++src ) {
                    simd data = _mm256_loadu_si256( src );

                    simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                    simd dataHi  = _mm256_unpackhi_epi8( data, zero );
                    simd sumLoHi = _mm256_add_epi16( dataLo, dataHi );

                    simdSum = _mm256_add_epi32( simdSum, _mm256_add_epi32( _mm256_unpacklo_epi16( sumLoHi, zero ),
                                                                           _mm256_unpackhi_epi16( sumLoHi, zero ) ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * imageX    = imageStart + totalSimdWidth;
                    const uint8_t * imageXEnd = imageX + nonSimdWidth;

                    for( ; imageX != imageXEnd; ++imageX )
                        (*out) += (*imageX);
                }

                uint32_t output[8] = { 0 };
                _mm256_storeu_si256( reinterpret_cast <simd*>(output), simdSum );
                
                (*out) += output[0] + output[1] + output[2] + output[3] + output[4] + output[5] + output[6] + output[7];
            }
        }
    }